

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablesio.cpp
# Opt level: O3

void __thiscall
bal::VariableTextReader::read_variable_element_hex_
          (VariableTextReader *this,Container<unsigned_int> *value)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint *puVar6;
  int i;
  long lVar7;
  byte bVar8;
  _func_int *p_Var9;
  uint uVar10;
  container_size_t cVar11;
  string local_50;
  
  p_Var9 = this->_vptr_VariableTextReader[-3];
  lVar3 = *(long *)(&this->field_0x10 + (long)p_Var9);
  if (0x3ffffffe < lVar3 - 3U >> 2) {
    __assert_fail("token_len > 2 && token_len <= CONTAINER_SIZE_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/variables/variablesio.cpp"
                  ,0xad,
                  "void bal::VariableTextReader::read_variable_element_hex_(Container<literalid_t> &)"
                 );
  }
  cVar11 = value->size_;
  uVar2 = value->allocated_size_;
  uVar10 = (cVar11 + (int)lVar3 * 4) - 8;
  if (uVar10 <= uVar2) {
    puVar6 = value->data_;
    goto LAB_001115f5;
  }
  uVar10 = uVar10 + (uVar2 >> 1);
  puVar6 = value->data_;
  if (uVar2 == uVar10) goto LAB_001115f5;
  if (puVar6 == (uint *)0x0) {
    if (uVar10 == 0) goto LAB_001115dd;
    puVar6 = (uint *)malloc((ulong)uVar10 << 2);
    value->data_ = puVar6;
    if (puVar6 == (uint *)0x0) {
      __assert_fail("data_ != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/base/container.hpp"
                    ,0x37,
                    "void bal::Container<unsigned int>::resize_(const container_size_t) [T = unsigned int]"
                   );
    }
    value->size_ = 0;
    cVar11 = 0;
  }
  else if (uVar10 == 0) {
    free(puVar6);
    value->data_ = (uint *)0x0;
LAB_001115dd:
    value->size_ = 0;
    cVar11 = 0;
    puVar6 = (uint *)0x0;
  }
  else {
    puVar6 = (uint *)realloc(puVar6,(ulong)uVar10 << 2);
    if (puVar6 == (uint *)0x0) {
      __assert_fail("new_data != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/base/container.hpp"
                    ,0x32,
                    "void bal::Container<unsigned int>::resize_(const container_size_t) [T = unsigned int]"
                   );
    }
    value->data_ = puVar6;
    cVar11 = value->size_;
  }
  value->allocated_size_ = uVar10;
  p_Var9 = this->_vptr_VariableTextReader[-3];
LAB_001115f5:
  lVar4 = *(long *)(&this->field_0x8 + (long)p_Var9);
  lVar5 = *(long *)(&this->field_0x18 + (long)p_Var9);
  if (*(char *)(lVar5 + lVar4) == '-') {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Negative hexadecimal values not supported","");
    TextReader::parse_error
              ((TextReader *)((long)&this->_vptr_VariableTextReader + (long)p_Var9),&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  puVar6 = puVar6 + cVar11;
  lVar7 = 2;
  do {
    cVar1 = *(char *)(lVar5 + lVar4 + lVar7);
    if (cVar1 < 'A') {
      bVar8 = cVar1 - 0x30;
    }
    else {
      bVar8 = cVar1 + 0xa9;
    }
    *puVar6 = bVar8 >> 3 & 1;
    puVar6[1] = bVar8 >> 2 & 1;
    puVar6[2] = bVar8 >> 1 & 1;
    puVar6[3] = bVar8 & 1;
    puVar6 = puVar6 + 4;
    lVar7 = lVar7 + 1;
  } while (lVar3 != lVar7);
  value->size_ = value->size_ + (int)lVar3 * 4 + -8;
  p_Var9 = this->_vptr_VariableTextReader[-3];
  *(long *)(&this->field_0x8 + (long)p_Var9) =
       *(long *)(&this->field_0x8 + (long)p_Var9) + *(long *)(&this->field_0x10 + (long)p_Var9);
  *(undefined8 *)(&this->field_0x10 + (long)p_Var9) = 0;
  *(undefined4 *)(&this->field_0x40 + (long)p_Var9) = 0;
  return;
}

Assistant:

inline void VariableTextReader::read_variable_element_hex_(Container<literalid_t>& value) {
        size_t token_len = get_current_token_len();
        assert(token_len > 2 && token_len <= CONTAINER_SIZE_MAX); // prefix
        const container_size_t value_size = ((container_size_t)token_len - 2) << 2;
        value.reserve(value_size);
        
        literalid_t* p_current = value.data_ + value.size_;
        const char* const token = get_current_token();
        
        if (token[0] == '-') {
            parse_error("Negative hexadecimal values not supported");
        };
        
        for (auto i = 2; i < token_len; i++) {
            char h = _hex_value(token[i]);
            p_current[0] = literal_t__constant(h & 0b1000);
            p_current[1] = literal_t__constant(h & 0b0100);
            p_current[2] = literal_t__constant(h & 0b0010);
            p_current[3] = literal_t__constant(h & 0b0001);
            p_current += 4;
        };
        
        value.size_ += value_size;
        skip_token();
    }